

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_ERET(DisasContext_conflict1 *s,arg_ERET *a)

{
  int iVar1;
  TCGContext_conflict1 *pTVar2;
  TCGTemp *a1;
  uintptr_t o_1;
  uint uVar3;
  TCGv_i32 tmp;
  TCGv_i32 pc;
  
  uVar3 = (uint)s->features;
  if ((uVar3 >> 0xd & 1) != 0) {
    if (s->user == 0) {
      pTVar2 = s->uc->tcg_ctx;
      iVar1 = s->current_el;
      a1 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
      pc = (TCGv_i32)((long)a1 - (long)pTVar2);
      if (iVar1 == 2) {
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i32,(TCGArg)a1,
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),0x248);
      }
      else {
        pTVar2 = s->uc->tcg_ctx;
        if (pTVar2->cpu_R[0xe] != pc) {
          tcg_gen_op2_aarch64(pTVar2,INDEX_op_mov_i32,(TCGArg)((long)pTVar2 + (long)pc),
                              (TCGArg)(pTVar2->cpu_R[0xe] + (long)pTVar2));
        }
      }
      gen_exception_return(s,pc);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return (_Bool)((byte)(uVar3 >> 0xd) & 1);
}

Assistant:

static bool trans_ERET(DisasContext *s, arg_ERET *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!arm_dc_feature(s, ARM_FEATURE_V7VE)) {
        return false;
    }
    if (IS_USER(s)) {
        unallocated_encoding(s);
        return true;
    }
    if (s->current_el == 2) {
        /* ERET from Hyp uses ELR_Hyp, not LR */
        tmp = load_cpu_field(tcg_ctx, elr_el[2]);
    } else {
        tmp = load_reg(s, 14);
    }
    gen_exception_return(s, tmp);
    return true;
}